

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O0

size_t ans_sint_compress<5u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  reference pvVar1;
  size_t sVar2;
  uint64_t *in_RCX;
  size_t in_RSI;
  uint32_t *in_RDI;
  uint32_t i_1;
  size_t cur_sym;
  uint32_t i;
  array<unsigned_long,_4UL> states;
  uint8_t *out_u8;
  ans_sint_encode<5U> ans_frame;
  uint32_t *in_u32;
  uint32_t num_states;
  uint8_t **in_stack_ffffffffffffff28;
  ans_sint_encode<5U> *in_stack_ffffffffffffff30;
  ans_sint_encode<5U> *out_u8_00;
  uint32_t in_stack_ffffffffffffff44;
  uint64_t *state;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar3;
  uint32_t *local_78;
  ans_sint_encode<5U> local_70;
  undefined4 local_24;
  uint64_t *local_20;
  uint32_t *puVar4;
  
  local_24 = 4;
  out_u8_00 = &local_70;
  local_20 = in_RCX;
  local_78 = in_RDI;
  ans_sint_encode<5U>::create(in_RDI,in_RSI);
  puVar4 = local_78;
  ans_sint_encode<5U>::serialize(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  for (uVar3 = 0; uVar3 < 4; uVar3 = uVar3 + 1) {
    in_stack_ffffffffffffff30 = (ans_sint_encode<5U> *)ans_sint_encode<5U>::initial_state(&local_70)
    ;
    pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                       ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    *pvVar1 = (value_type_conflict2)in_stack_ffffffffffffff30;
  }
  for (state = (uint64_t *)0x0; ((long)local_20 - (long)state & 3U) != 0;
      state = (uint64_t *)((long)state + 1)) {
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
               (size_type)in_stack_ffffffffffffff28);
    ans_sint_encode<5U>::encode_symbol
              ((ans_sint_encode<5U> *)CONCAT44(uVar3,in_stack_ffffffffffffff50),state,
               in_stack_ffffffffffffff44,(uint8_t **)out_u8_00);
  }
  for (; state != local_20; state = (uint64_t *)((long)state + 4)) {
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
               (size_type)in_stack_ffffffffffffff28);
    ans_sint_encode<5U>::encode_symbol
              ((ans_sint_encode<5U> *)CONCAT44(uVar3,in_stack_ffffffffffffff50),state,
               in_stack_ffffffffffffff44,(uint8_t **)out_u8_00);
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
               (size_type)in_stack_ffffffffffffff28);
    ans_sint_encode<5U>::encode_symbol
              ((ans_sint_encode<5U> *)CONCAT44(uVar3,in_stack_ffffffffffffff50),state,
               in_stack_ffffffffffffff44,(uint8_t **)out_u8_00);
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
               (size_type)in_stack_ffffffffffffff28);
    ans_sint_encode<5U>::encode_symbol
              ((ans_sint_encode<5U> *)CONCAT44(uVar3,in_stack_ffffffffffffff50),state,
               in_stack_ffffffffffffff44,(uint8_t **)out_u8_00);
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
               (size_type)in_stack_ffffffffffffff28);
    ans_sint_encode<5U>::encode_symbol
              ((ans_sint_encode<5U> *)CONCAT44(uVar3,in_stack_ffffffffffffff50),state,
               in_stack_ffffffffffffff44,(uint8_t **)out_u8_00);
  }
  for (uVar3 = 0; uVar3 < 4; uVar3 = uVar3 + 1) {
    pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                       ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    ans_sint_encode<5U>::flush_state(&local_70,*pvVar1,(uint8_t **)&local_78);
  }
  sVar2 = (long)local_78 - (long)puVar4;
  ans_sint_encode<5U>::~ans_sint_encode(in_stack_ffffffffffffff30);
  return sVar2;
}

Assistant:

size_t ans_sint_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    const uint32_t num_states = 4;
#ifdef RECORD_STATS
    auto start_compress = std::chrono::high_resolution_clock::now();
#endif

    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_sint_encode<H_approx>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    std::array<uint64_t, num_states> states;

    // start encoding
    for (uint32_t i = 0; i < num_states; i++)
        states[i] = ans_frame.initial_state();

#ifdef RECORD_STATS
    auto stop_prelude = std::chrono::high_resolution_clock::now();
    get_stats().prelude_bytes = out_u8 - reinterpret_cast<uint8_t*>(dst);
    get_stats().prelude_time_ns = (stop_prelude - start_compress).count();
#endif

    // std::cout << "encoding" << std::endl;
    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % num_states != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += num_states;
    }

    // flush final state
    for (uint32_t i = 0; i < num_states; i++)
        ans_frame.flush_state(states[i], out_u8);

#ifdef RECORD_STATS
    auto stop_compress = std::chrono::high_resolution_clock::now();
    get_stats().encode_bytes = (out_u8 - reinterpret_cast<uint8_t*>(dst))
        - get_stats().prelude_bytes;
    get_stats().encode_time_ns = (stop_compress - stop_prelude).count();
#endif

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}